

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O1

bool __thiscall vox::VoxWriter::m_OpenFileForWriting(VoxWriter *this,string *vFilePathName)

{
  FILE *pFVar1;
  int *piVar2;
  int iVar3;
  
  pFVar1 = fopen((vFilePathName->_M_dataplus)._M_p,"wb");
  this->m_File = (FILE *)pFVar1;
  iVar3 = 0;
  if (pFVar1 == (FILE *)0x0) {
    piVar2 = __errno_location();
    iVar3 = *piVar2;
  }
  this->lastError = iVar3;
  return iVar3 == 0;
}

Assistant:

bool VoxWriter::m_OpenFileForWriting(const std::string& vFilePathName) {
#if _MSC_VER
    lastError = fopen_s(&m_File, vFilePathName.c_str(), "wb");
#else
    m_File    = fopen(vFilePathName.c_str(), "wb");
    lastError = m_File ? 0 : errno;
#endif
    if (lastError != 0)
        return false;
    return true;
}